

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BSA_SpikeDecodingSynapse.cpp
# Opt level: O2

void __thiscall BSA_SpikeDecodingSynapse::update(BSA_SpikeDecodingSynapse *this)

{
  double dVar1;
  Event *pEVar2;
  Population *pPVar3;
  Logging *this_00;
  reference pdVar4;
  int j;
  long __n;
  int i;
  long lVar5;
  double local_38;
  
  for (lVar5 = 0; lVar5 < this->inputSize; lVar5 = lVar5 + 1) {
    std::deque<double,_std::allocator<double>_>::pop_front
              ((this->input).
               super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar5);
    local_38 = 0.0;
    std::deque<double,_std::allocator<double>_>::emplace_back<double>
              ((this->input).
               super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar5,&local_38);
    if ((((this->super_Synapse).from_population)->output).
        super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar5]->type == Spike) {
      for (__n = 0; (double)(int)__n < this->param->filter_length; __n = __n + 1) {
        dVar1 = (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[__n];
        pdVar4 = std::_Deque_iterator<double,_double_&,_double_*>::operator[]
                           (&(this->input).
                             super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar5].
                             super__Deque_base<double,_std::allocator<double>_>._M_impl.
                             super__Deque_impl_data._M_start,__n);
        *pdVar4 = dVar1 + *pdVar4;
      }
    }
    pEVar2 = (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
             super__Vector_impl_data._M_start[lVar5];
    pdVar4 = std::_Deque_iterator<double,_double_&,_double_*>::operator[]
                       (&(this->input).
                         super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar5].
                         super__Deque_base<double,_std::allocator<double>_>._M_impl.
                         super__Deque_impl_data._M_start,0);
    pEVar2[1]._vptr_Event = (_func_int **)(*pdVar4 * this->param->threshold);
    pPVar3 = (this->super_Synapse).to_population;
    (*pPVar3->_vptr_Population[5])
              (pPVar3,0,(this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl
                        .super__Vector_impl_data._M_start[lVar5]);
    this_00 = this->logger;
    pdVar4 = std::_Deque_iterator<double,_double_&,_double_*>::operator[]
                       (&(this->input).
                         super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar5].
                         super__Deque_base<double,_std::allocator<double>_>._M_impl.
                         super__Deque_impl_data._M_start,0);
    Logging::logValue(this_00,(long)this,(int)lVar5,3,*pdVar4 * this->param->threshold);
  }
  return;
}

Assistant:

void BSA_SpikeDecodingSynapse::update() {
    for(int i = 0; i < inputSize; i++) {
        input[i].pop_front();
        input[i].push_back(0);
        if(from_population->output[i]->type == EventType::Spike) {
            for(int j = 0; j < param->filter_length; j++) {
                input[i][j] += filter[j];
            }
        }
        static_cast<ValueEvent*>(output[i])->setValue(input[i][0]*param->threshold);
        to_population->setInput(0, output[i]);
        logger->logValue((long)this, i, EventType::Value, input[i][0]*param->threshold);
    }
}